

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_traceir(lua_State *L)

{
  byte bVar1;
  IRIns *pIVar2;
  TValue *pTVar3;
  uint uVar4;
  GCtrace *pGVar5;
  ulong uVar6;
  int iVar7;
  
  pGVar5 = jit_checktrace(L);
  uVar4 = lj_lib_checkint(L,2);
  iVar7 = 0;
  if ((pGVar5 != (GCtrace *)0x0 && uVar4 < 0xffff8000) && (uVar4 + 0x8000 < pGVar5->nins)) {
    pIVar2 = pGVar5->ir;
    uVar6 = (ulong)(uVar4 + 0x8000);
    bVar1 = lj_ir_mode[*(byte *)((long)pIVar2 + uVar6 * 8 + 5)];
    L->top[-2].n = (double)bVar1;
    L->top[-1].n = (double)*(ushort *)((long)pIVar2 + uVar6 * 8 + 4);
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->n = (double)(int)((pIVar2[uVar6].field_0.op1 - 0x8000) +
                             (uint)((bVar1 & 3) != 0) * 0x8000);
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->n = (double)(int)((*(ushort *)((long)pIVar2 + uVar6 * 8 + 2) - 0x8000) +
                             (uint)((bVar1 & 0xc) != 0) * 0x8000);
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->n = (double)*(ushort *)((long)pIVar2 + uVar6 * 8 + 6);
    iVar7 = 5;
  }
  return iVar7;
}

Assistant:

LJLIB_CF(jit_util_traceir)
{
  GCtrace *T = jit_checktrace(L);
  IRRef ref = (IRRef)lj_lib_checkint(L, 2) + REF_BIAS;
  if (T && ref >= REF_BIAS && ref < T->nins) {
    IRIns *ir = &T->ir[ref];
    int32_t m = lj_ir_mode[ir->o];
    setintV(L->top-2, m);
    setintV(L->top-1, ir->ot);
    setintV(L->top++, (int32_t)ir->op1 - (irm_op1(m)==IRMref ? REF_BIAS : 0));
    setintV(L->top++, (int32_t)ir->op2 - (irm_op2(m)==IRMref ? REF_BIAS : 0));
    setintV(L->top++, ir->prev);
    return 5;
  }
  return 0;
}